

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

MatchResult __thiscall
r_exec::HLPController::check_predicted_evidences(HLPController *this,_Fact *target,_Fact **evidence)

{
  MatchResult MVar1;
  bool bVar2;
  uint64_t now_00;
  EEntry *this_00;
  PEEntry *pPVar3;
  _Fact *p_Var4;
  P *this_01;
  float fVar5;
  float fVar6;
  iterator iVar7;
  const_iterator cVar8;
  const_iterator local_90;
  iterator local_80;
  iterator local_70;
  undefined1 local_60 [8];
  const_iterator e;
  uint64_t now;
  lock_guard<std::mutex> guard;
  MatchResult r;
  _Fact **evidence_local;
  _Fact *target_local;
  HLPController *this_local;
  
  guard._M_device._4_4_ = MATCH_FAILURE;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&now,&(this->predicted_evidences).mutex);
  now_00 = (*Now)();
  r_code::list<r_exec::HLPController::PEEntry>::const_iterator::const_iterator
            ((const_iterator *)local_60);
  local_70 = r_code::list<r_exec::HLPController::PEEntry>::begin
                       (&(this->predicted_evidences).evidences);
  r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator=
            ((const_iterator *)local_60,&local_70);
LAB_0024b0fe:
  do {
    iVar7 = r_code::list<r_exec::HLPController::PEEntry>::end
                      (&(this->predicted_evidences).evidences);
    local_80 = iVar7;
    bVar2 = r_code::list<r_exec::HLPController::PEEntry>::_iterator::operator!=
                      ((_iterator *)local_60,&local_80.super__iterator);
    if (!bVar2) {
      *evidence = (_Fact *)0x0;
LAB_0024b335:
      MVar1 = guard._M_device._4_4_;
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&now);
      return MVar1;
    }
    this_00 = &r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator*
                         ((const_iterator *)local_60)->super_EEntry;
    bVar2 = EEntry::is_too_old(this_00,now_00);
    if (!bVar2) {
      pPVar3 = r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator*
                         ((const_iterator *)local_60);
      p_Var4 = core::P<r_exec::_Fact>::operator->((P<r_exec::_Fact> *)pPVar3);
      guard._M_device._4_4_ = _Fact::is_evidence(p_Var4,target);
      if (guard._M_device._4_4_ != MATCH_FAILURE) {
        fVar5 = _Fact::get_cfd(target);
        pPVar3 = r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator*
                           ((const_iterator *)local_60);
        p_Var4 = core::P<r_exec::_Fact>::operator->((P<r_exec::_Fact> *)pPVar3);
        fVar6 = _Fact::get_cfd(p_Var4);
        if (fVar5 < fVar6) {
          this_01 = (P *)r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator*
                                   ((const_iterator *)local_60);
          p_Var4 = core::P::operator_cast_to__Fact_(this_01);
          *evidence = p_Var4;
          goto LAB_0024b335;
        }
        guard._M_device._4_4_ = MATCH_FAILURE;
      }
      r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator++
                ((const_iterator *)local_60);
      goto LAB_0024b0fe;
    }
    cVar8 = r_code::list<r_exec::HLPController::PEEntry>::erase
                      (&(this->predicted_evidences).evidences,(const_iterator *)local_60);
    local_90 = cVar8;
    r_code::list<r_exec::HLPController::PEEntry>::const_iterator::operator=
              ((const_iterator *)local_60,&local_90);
  } while( true );
}

Assistant:

MatchResult HLPController::check_predicted_evidences(_Fact *target, _Fact *&evidence)
{
    MatchResult r = MATCH_FAILURE;
    std::lock_guard<std::mutex> guard(predicted_evidences.mutex);
    uint64_t now = Now();
    r_code::list<PEEntry>::const_iterator e;

    for (e = predicted_evidences.evidences.begin(); e != predicted_evidences.evidences.end();) {
        if ((*e).is_too_old(now)) { // garbage collection. // garbage collection.
            e = predicted_evidences.evidences.erase(e);
        } else {
            if ((r = (*e).evidence->is_evidence(target)) != MATCH_FAILURE) {
                if (target->get_cfd() < (*e).evidence->get_cfd()) {
                    evidence = (*e).evidence;
                    return r;
                } else {
                    r = MATCH_FAILURE;
                }
            }

            ++e;
        }
    }

    evidence = nullptr;
    return r;
}